

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode)

{
  XmlWriter *this_00;
  pointer psVar1;
  shared_ptr<Catch::CumulativeReporterBase::SectionNode> *childNode;
  pointer psVar2;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  JunitReporter *local_78;
  ScopedElement local_70;
  string name;
  ScopedElement e;
  
  local_78 = this;
  trim(&name,(string *)sectionNode);
  if (rootName->_M_string_length != 0) {
    std::operator+(&local_98,rootName,'/');
    std::operator+(&local_b8,&local_98,&name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&name,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"testcase",(allocator<char> *)&local_98);
    this_00 = &local_78->xml;
    XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"classname",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute(this_00,&local_b8,&name);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"name",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute<char[5]>(this_00,&local_b8,(char (*) [5])"root");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"classname",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute(this_00,&local_b8,className);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"name",(allocator<char> *)&local_98);
      XmlWriter::writeAttribute(this_00,&local_b8,&name);
    }
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"time",(allocator<char> *)&local_70);
    Detail::stringify<double>(&local_98,&(sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(this_00,&local_b8,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"status",(allocator<char> *)&local_98);
    XmlWriter::writeAttribute<char[4]>(this_00,&local_b8,(char (*) [4])0x175aaf);
    std::__cxx11::string::~string((string *)&local_b8);
    writeAssertions(local_78,sectionNode);
    if ((sectionNode->stdOut)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"system-out",&local_b9)
      ;
      XmlWriter::scopedElement((XmlWriter *)&local_70,(string *)this_00,(XmlFormatting)&local_b8);
      trim(&local_98,&sectionNode->stdOut);
      XmlWriter::writeText(local_70.m_writer,&local_98,Newline);
      std::__cxx11::string::~string((string *)&local_98);
      XmlWriter::ScopedElement::~ScopedElement(&local_70);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"system-err",&local_b9)
      ;
      XmlWriter::scopedElement((XmlWriter *)&local_70,(string *)this_00,(XmlFormatting)&local_b8);
      trim(&local_98,&sectionNode->stdErr);
      XmlWriter::writeText(local_70.m_writer,&local_98,Newline);
      std::__cxx11::string::~string((string *)&local_98);
      XmlWriter::ScopedElement::~ScopedElement(&local_70);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    XmlWriter::ScopedElement::~ScopedElement(&e);
  }
  psVar1 = (sectionNode->childSections).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (sectionNode->childSections).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    if (className->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"",(allocator<char> *)&local_98);
      writeSection(local_78,&name,&local_b8,
                   (psVar2->
                   super___shared_ptr<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      writeSection(local_78,className,&name,
                   (psVar2->
                   super___shared_ptr<Catch::CumulativeReporterBase::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr);
    }
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void JunitReporter::writeSection(std::string const &className,
        std::string const &rootName,
        SectionNode const &sectionNode) {
        std::string name = trim(sectionNode.stats.sectionInfo.name);
        if (!rootName.empty())
            name = rootName + '/' + name;

        if (!sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty()) {
            XmlWriter::ScopedElement e = xml.scopedElement("testcase");
            if (className.empty()) {
                xml.writeAttribute("classname", name);
                xml.writeAttribute("name", "root");
            }
            else {
                xml.writeAttribute("classname", className);
                xml.writeAttribute("name", name);
            }
            xml.writeAttribute("time", ::Catch::Detail::stringify(sectionNode.stats.durationInSeconds));
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute("status", "run");

            writeAssertions(sectionNode);

            if (!sectionNode.stdOut.empty())
                xml.scopedElement("system-out").writeText(trim(sectionNode.stdOut), XmlFormatting::Newline);
            if (!sectionNode.stdErr.empty())
                xml.scopedElement("system-err").writeText(trim(sectionNode.stdErr), XmlFormatting::Newline);
        }
        for (auto const &childNode : sectionNode.childSections)
            if (className.empty())
                writeSection(name, "", *childNode);
            else
                writeSection(className, name, *childNode);
    }